

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

void set_add_znode_hash(VecZNode *v,ZNode *z)

{
  uint uVar1;
  ZNode **ppZVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint i;
  ZNode **__ptr;
  
  uVar1 = v->n;
  uVar5 = (ulong)uVar1;
  if (uVar5 == 0) {
    v->i = 2;
    uVar4 = 2;
    __ptr = (ZNode **)0x0;
  }
  else {
    uVar4 = (ulong)z->pn % uVar5;
    __ptr = v->v;
    for (uVar3 = 0; ((uint)uVar4 < uVar1 && (uVar3 < 5)); uVar3 = uVar3 + 1) {
      if (__ptr[uVar4] == (ZNode *)0x0) {
        __ptr[uVar4] = z;
        return;
      }
      uVar4 = (ulong)((uint)uVar4 + 1) % (ulong)uVar1;
    }
    uVar1 = v->i + 2;
    uVar4 = (ulong)uVar1;
    v->i = uVar1;
  }
  uVar1 = d_prime2[uVar4];
  v->n = uVar1;
  ppZVar2 = (ZNode **)calloc(1,(ulong)uVar1 << 3);
  v->v = ppZVar2;
  if (__ptr != (ZNode **)0x0) {
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      if (__ptr[uVar4] != (ZNode *)0x0) {
        set_add_znode(v,__ptr[uVar4]);
      }
    }
    free(__ptr);
  }
  set_add_znode(v,z);
  return;
}

Assistant:

static void set_add_znode_hash(VecZNode *v, ZNode *z) {
  uint i, j, n = v->n;
  VecZNode vv;
  vec_clear(&vv);
  if (n) {
    uint h = ((uintptr_t)z->pn) % n;
    for (i = h, j = 0; i < v->n && j < SET_MAX_SEQUENTIAL; i = ((i + 1) % n), j++) {
      if (!v->v[i]) {
        v->v[i] = z;
        return;
      }
    }
  }
  if (!n) {
    vv.v = NULL;
    v->i = INITIAL_SET_SIZE_INDEX;
  } else {
    vv.v = (void *)v->v;
    vv.n = v->n;
    v->i = v->i + 2;
  }
  v->n = d_prime2[v->i];
  v->v = MALLOC(v->n * sizeof(void *));
  memset(v->v, 0, v->n * sizeof(void *));
  if (vv.v) {
    set_union_znode(v, &vv);
    FREE(vv.v);
  }
  set_add_znode(v, z);
}